

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

optional<int> __thiscall node::anon_unknown_2::ChainImpl::getHeight(ChainImpl *this)

{
  pointer ppCVar1;
  pointer ppCVar2;
  ChainstateManager *this_00;
  Chainstate *pCVar3;
  ulong uVar4;
  int iVar5;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock27;
  unique_lock<std::recursive_mutex> uStack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_28,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
             ,0x21f,false);
  this_00 = chainman(this);
  pCVar3 = ChainstateManager::ActiveChainstate(this_00);
  ppCVar1 = (pCVar3->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar2 = (pCVar3->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_28);
  uVar4 = 0;
  iVar5 = (int)((ulong)((long)ppCVar1 - (long)ppCVar2) >> 3);
  if (0 < iVar5) {
    uVar4 = 0x100000000;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (optional<int>)(uVar4 | iVar5 - 1);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int> getHeight() override
    {
        const int height{WITH_LOCK(::cs_main, return chainman().ActiveChain().Height())};
        return height >= 0 ? std::optional{height} : std::nullopt;
    }